

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O0

int __thiscall
glcts::UniformBlocksLayoutBindingCase::maxBindings(UniformBlocksLayoutBindingCase *this)

{
  Functions *pFVar1;
  GLint local_14;
  UniformBlocksLayoutBindingCase *pUStack_10;
  int units;
  UniformBlocksLayoutBindingCase *this_local;
  
  local_14 = 0;
  pUStack_10 = this;
  pFVar1 = LayoutBindingBaseCase::gl(&this->super_LayoutBindingBaseCase);
  (*pFVar1->getIntegerv)(0x8a2f,&local_14);
  return local_14;
}

Assistant:

int maxBindings()
	{
		int units = 0;
		gl().getIntegerv(GL_MAX_UNIFORM_BUFFER_BINDINGS, &units);
		return units;
	}